

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

uchar duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_short,unsigned_char>
                (unsigned_short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  byte bVar1;
  string local_40;
  
  if (0xff < input) {
    CastExceptionText<unsigned_short,unsigned_char>
              (&local_40,(duckdb *)(ulong)input,(unsigned_short)idx);
    bVar1 = HandleVectorCastError::Operation<unsigned_char>
                      (&local_40,mask,idx,(VectorTryCastData *)dataptr);
    input = (unsigned_short)bVar1;
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return (uchar)input;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}